

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_ecc_weierstrass_add_general(void)

{
  WeierstrassCurve *wc_00;
  WeierstrassPoint *wp;
  WeierstrassPoint *wp_00;
  size_t sVar1;
  WeierstrassPoint *pWVar2;
  WeierstrassPoint *src;
  WeierstrassPoint *r;
  WeierstrassPoint *B;
  WeierstrassPoint *A;
  size_t j;
  size_t i;
  WeierstrassPoint *b;
  WeierstrassPoint *a;
  WeierstrassCurve *wc;
  
  wc_00 = wcurve();
  wp = ecc_weierstrass_point_new_identity(wc_00);
  wp_00 = ecc_weierstrass_point_new_identity(wc_00);
  j = 0;
  while( true ) {
    sVar1 = (*looplimit)(5);
    if (sVar1 <= j) break;
    A = (WeierstrassPoint *)0x0;
    while( true ) {
      pWVar2 = (WeierstrassPoint *)(*looplimit)(5);
      if (pWVar2 <= A) break;
      pWVar2 = wpoint(wc_00,j);
      src = wpoint(wc_00,(size_t)A);
      ecc_weierstrass_point_copy_into(wp,pWVar2);
      ecc_weierstrass_point_copy_into(wp_00,src);
      ecc_weierstrass_point_free(pWVar2);
      ecc_weierstrass_point_free(src);
      log_start();
      pWVar2 = ecc_weierstrass_add_general(wp,wp_00);
      log_end();
      ecc_weierstrass_point_free(pWVar2);
      A = (WeierstrassPoint *)((long)&A->X + 1);
    }
    j = j + 1;
  }
  ecc_weierstrass_point_free(wp);
  ecc_weierstrass_point_free(wp_00);
  ecc_weierstrass_curve_free(wc_00);
  return;
}

Assistant:

static void test_ecc_weierstrass_add_general(void)
{
    WeierstrassCurve *wc = wcurve();
    WeierstrassPoint *a = ecc_weierstrass_point_new_identity(wc);
    WeierstrassPoint *b = ecc_weierstrass_point_new_identity(wc);
    for (size_t i = 0; i < looplimit(5); i++) {
        for (size_t j = 0; j < looplimit(5); j++) {
            WeierstrassPoint *A = wpoint(wc, i), *B = wpoint(wc, j);
            ecc_weierstrass_point_copy_into(a, A);
            ecc_weierstrass_point_copy_into(b, B);
            ecc_weierstrass_point_free(A);
            ecc_weierstrass_point_free(B);

            log_start();
            WeierstrassPoint *r = ecc_weierstrass_add_general(a, b);
            log_end();
            ecc_weierstrass_point_free(r);
        }
    }
    ecc_weierstrass_point_free(a);
    ecc_weierstrass_point_free(b);
    ecc_weierstrass_curve_free(wc);
}